

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer this;
  RequestBuilder *pRVar1;
  anon_class_1_0_00000001 local_d9;
  completion_fn_t local_d8;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [48];
  undefined1 local_30 [16];
  Client client;
  char **argv_local;
  int argc_local;
  
  client.worker_._M_t.
  super___uniq_ptr_impl<restincurl::Worker,_std::default_delete<restincurl::Worker>_>._M_t.
  super__Tuple_impl<0UL,_restincurl::Worker_*,_std::default_delete<restincurl::Worker>_>.
  super__Head_base<0UL,_restincurl::Worker_*,_false>._M_head_impl =
       (__uniq_ptr_data<restincurl::Worker,_std::default_delete<restincurl::Worker>,_true,_true>)
       (__uniq_ptr_data<restincurl::Worker,_std::default_delete<restincurl::Worker>,_true,_true>)
       argv;
  restincurl::Client::Client((Client *)(local_30 + 8),true);
  restincurl::Client::Build((Client *)local_30);
  this = std::
         unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>::
         operator->((unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>
                     *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"http://localhost:3001/normal/posts",&local_61);
  pRVar1 = restincurl::RequestBuilder::Get(this,(string *)local_60);
  pRVar1 = restincurl::RequestBuilder::AcceptJson(pRVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"X-Client",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"restincurl",&local_b1);
  pRVar1 = restincurl::RequestBuilder::Header(pRVar1,(string *)local_88,(string *)local_b0);
  pRVar1 = restincurl::RequestBuilder::Trace(pRVar1,true);
  std::function<void(restincurl::Result_const&)>::function<main::__0,void>
            ((function<void(restincurl::Result_const&)> *)&local_d8,&local_d9);
  pRVar1 = restincurl::RequestBuilder::WithCompletion(pRVar1,&local_d8);
  restincurl::RequestBuilder::Execute(pRVar1);
  std::function<void_(const_restincurl::Result_&)>::~function(&local_d8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>::
  ~unique_ptr((unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>
               *)local_30);
  restincurl::Client::CloseWhenFinished((Client *)(local_30 + 8));
  restincurl::Client::WaitForFinish((Client *)(local_30 + 8));
  restincurl::Client::~Client((Client *)(local_30 + 8));
  return 0;
}

Assistant:

int main( int argc, char * argv[]) {

    restincurl::Client client;

    client.Build()->Get("http://localhost:3001/normal/posts")
        .AcceptJson()
        .Header("X-Client", "restincurl")
        .Trace()
        .WithCompletion([&](const Result& result) {
            clog << "In callback! HTTP result code was " << result.http_response_code << endl;
            clog << "Data was " << result.body.size() << " bytes." << endl;
        })
        .Execute();

    // If the client goes out of scope, it will terminate all ongoing
    // requests, so we need to wait here for the request to finish.

    // Tell client that we want to close when the request is finish
    client.CloseWhenFinished();

    // Wait for the worker-thread in the client to quit
    client.WaitForFinish();
}